

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::LookupBucketFor<llbuild::core::KeyID>
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,KeyID *Val,DenseMapPair<llbuild::core::KeyID,_DBKeyID> **FoundBucket)

{
  ValueTy VVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ValueTy VVar5;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar6;
  uint uVar7;
  ulong uVar8;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar9;
  int iVar10;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar6 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
LAB_001d51db:
    bVar3 = false;
  }
  else {
    VVar1 = Val->_value;
    if (VVar1 + 1 < 2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, LookupKeyT = llbuild::core::KeyID]"
                   );
    }
    lVar2 = *(long *)this;
    uVar4 = *(int *)(this + 0x10) - 1;
    uVar8 = (ulong)((int)VVar1 * 0x25 & uVar4);
    pDVar6 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)(lVar2 + uVar8 * 0x10);
    VVar5 = *(ValueTy *)(lVar2 + uVar8 * 0x10);
    bVar3 = true;
    if (VVar1 != VVar5) {
      iVar10 = 1;
      pDVar9 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
      do {
        if (VVar5 == 0) {
          if (pDVar9 != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
            pDVar6 = pDVar9;
          }
          goto LAB_001d51db;
        }
        if (VVar5 == 0xffffffffffffffff &&
            pDVar9 == (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
          pDVar9 = pDVar6;
        }
        uVar7 = (int)uVar8 + iVar10;
        iVar10 = iVar10 + 1;
        uVar8 = (ulong)(uVar7 & uVar4);
        pDVar6 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)(lVar2 + uVar8 * 0x10);
        VVar5 = *(ValueTy *)(lVar2 + uVar8 * 0x10);
      } while (VVar1 != VVar5);
    }
  }
  *FoundBucket = pDVar6;
  return bVar3;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }